

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode Curl_mime_duppart(curl_mimepart *dst,curl_mimepart *src)

{
  CURLcode CVar1;
  curl_mime *subparts;
  curl_mimepart *dst_00;
  curl_slist *headers;
  curl_mimepart *src_00;
  
  switch(src->kind) {
  case MIMEKIND_NONE:
    goto switchD_0040d333_caseD_0;
  case MIMEKIND_DATA:
    CVar1 = curl_mime_data(dst,src->data,src->datasize);
    break;
  case MIMEKIND_FILE:
    CVar1 = curl_mime_filedata(dst,src->data);
    if (CVar1 != CURLE_READ_ERROR) break;
    goto switchD_0040d333_caseD_0;
  case MIMEKIND_CALLBACK:
    CVar1 = curl_mime_data_cb(dst,src->datasize,src->readfunc,src->seekfunc,src->freefunc,src->arg);
    break;
  case MIMEKIND_MULTIPART:
    subparts = curl_mime_init(dst->easy);
    CVar1 = CURLE_OUT_OF_MEMORY;
    if (subparts != (curl_mime *)0x0) {
      CVar1 = curl_mime_subparts(dst,subparts);
    }
    src_00 = (curl_mimepart *)src->arg;
    while ((CVar1 == CURLE_OK && (src_00 = src_00->nextpart, src_00 != (curl_mimepart *)0x0))) {
      dst_00 = curl_mime_addpart(subparts);
      CVar1 = CURLE_OUT_OF_MEMORY;
      if (dst_00 != (curl_mimepart *)0x0) {
        CVar1 = Curl_mime_duppart(dst_00,src_00);
      }
    }
    break;
  default:
    CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_0040d453;
  }
  if (CVar1 != CURLE_OK) goto LAB_0040d453;
switchD_0040d333_caseD_0:
  if (src->userheaders != (curl_slist *)0x0) {
    headers = Curl_slist_duplicate(src->userheaders);
    if (headers == (curl_slist *)0x0) {
      CVar1 = CURLE_OUT_OF_MEMORY;
      goto LAB_0040d453;
    }
    CVar1 = curl_mime_headers(dst,headers,1);
    if (CVar1 != CURLE_OK) {
      curl_slist_free_all(headers);
      goto LAB_0040d453;
    }
  }
  dst->encoder = src->encoder;
  CVar1 = curl_mime_type(dst,src->mimetype);
  if (((CVar1 == CURLE_OK) && (CVar1 = curl_mime_name(dst,src->name), CVar1 == CURLE_OK)) &&
     (CVar1 = curl_mime_filename(dst,src->filename), CVar1 == CURLE_OK)) {
    return CURLE_OK;
  }
LAB_0040d453:
  Curl_mime_cleanpart(dst);
  return CVar1;
}

Assistant:

CURLcode Curl_mime_duppart(curl_mimepart *dst, const curl_mimepart *src)
{
  curl_mime *mime;
  curl_mimepart *d;
  const curl_mimepart *s;
  CURLcode res = CURLE_OK;

  DEBUGASSERT(dst);

  /* Duplicate content. */
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    res = curl_mime_data(dst, src->data, (size_t) src->datasize);
    break;
  case MIMEKIND_FILE:
    res = curl_mime_filedata(dst, src->data);
    /* Do not abort duplication if file is not readable. */
    if(res == CURLE_READ_ERROR)
      res = CURLE_OK;
    break;
  case MIMEKIND_CALLBACK:
    res = curl_mime_data_cb(dst, src->datasize, src->readfunc,
                            src->seekfunc, src->freefunc, src->arg);
    break;
  case MIMEKIND_MULTIPART:
    /* No one knows about the cloned subparts, thus always attach ownership
       to the part. */
    mime = curl_mime_init(dst->easy);
    res = mime? curl_mime_subparts(dst, mime): CURLE_OUT_OF_MEMORY;

    /* Duplicate subparts. */
    for(s = ((curl_mime *) src->arg)->firstpart; !res && s; s = s->nextpart) {
      d = curl_mime_addpart(mime);
      res = d? Curl_mime_duppart(d, s): CURLE_OUT_OF_MEMORY;
    }
    break;
  default:  /* Invalid kind: should not occur. */
    res = CURLE_BAD_FUNCTION_ARGUMENT;  /* Internal error? */
    break;
  }

  /* Duplicate headers. */
  if(!res && src->userheaders) {
    struct curl_slist *hdrs = Curl_slist_duplicate(src->userheaders);

    if(!hdrs)
      res = CURLE_OUT_OF_MEMORY;
    else {
      /* No one but this procedure knows about the new header list,
         so always take ownership. */
      res = curl_mime_headers(dst, hdrs, TRUE);
      if(res)
        curl_slist_free_all(hdrs);
    }
  }

  if(!res) {
    /* Duplicate other fields. */
    dst->encoder = src->encoder;
    res = curl_mime_type(dst, src->mimetype);
  }
  if(!res)
    res = curl_mime_name(dst, src->name);
  if(!res)
    res = curl_mime_filename(dst, src->filename);

  /* If an error occurred, rollback. */
  if(res)
    Curl_mime_cleanpart(dst);

  return res;
}